

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tct3.cpp
# Opt level: O1

int __thiscall CTcSymLocal::write_to_debug_frame(CTcSymLocal *this,int test_only)

{
  short sVar1;
  short sVar2;
  CTcCodeStream *this_00;
  uint16_t tmp;
  undefined2 uVar3;
  ushort uVar4;
  int iVar5;
  undefined8 in_RAX;
  CTcStreamAnchor *pCVar6;
  uint uVar7;
  size_t in_RCX;
  byte bVar8;
  CTcCodeStream **ppCVar9;
  char buf [2];
  undefined8 uStack_38;
  ulong __n;
  
  if (test_only == 0) {
    bVar8 = 1;
    if ((2 < (this->super_CTcSymLocalBase).super_CTcSymbol.super_CTcSymbolBase.super_CVmHashEntryCS.
             super_CVmHashEntry.len_) && (1 < G_sizes.dbg_fmt_vsn)) {
      bVar8 = (G_cg->field_0xd0 & 4) >> 2;
    }
    ppCVar9 = &G_cs;
    if (((this->super_CTcSymLocalBase).field_0x64 & 0x10) == 0) {
      uVar3 = (undefined2)(this->super_CTcSymLocalBase).var_num_;
    }
    else {
      uVar3 = (undefined2)(this->super_CTcSymLocalBase).ctx_var_num_;
    }
    uStack_38._6_2_ = (undefined2)((ulong)in_RAX >> 0x30);
    uStack_38._0_4_ = (uint)in_RAX;
    uStack_38._0_6_ = CONCAT24(uVar3,(uint)uStack_38);
    CTcDataStream::write(&G_cs->super_CTcDataStream,(int)&uStack_38 + 4,(void *)0x2,in_RCX);
    uVar4 = *(ushort *)&(this->super_CTcSymLocalBase).field_0x64;
    uVar7 = uVar4 & 1;
    __n = (ulong)uVar7;
    uVar4 = uVar4 >> 3 & 2;
    sVar2 = (short)uVar7;
    sVar1 = uVar4 + sVar2 + 4;
    if (bVar8 != 0) {
      sVar1 = uVar4 + sVar2;
    }
    uStack_38._0_6_ = CONCAT24(sVar1,(uint)uStack_38);
    CTcDataStream::write(&G_cs->super_CTcDataStream,(int)&uStack_38 + 4,(void *)0x2,__n);
    this_00 = G_cs;
    iVar5 = CTcSymLocalBase::get_ctx_arr_idx(&this->super_CTcSymLocalBase);
    uStack_38._0_6_ = CONCAT24((short)iVar5,(uint)uStack_38);
    CTcDataStream::write(&this_00->super_CTcDataStream,(int)&uStack_38 + 4,(void *)0x2,__n);
    if (6 < G_sizes.lcl_hdr) {
      iVar5 = G_sizes.lcl_hdr + -5;
      do {
        uStack_38._0_5_ = (uint5)(uint)uStack_38;
        CTcDataStream::write(&G_cs->super_CTcDataStream,(int)&uStack_38 + 4,(void *)0x1,__n);
        iVar5 = iVar5 + -1;
      } while (1 < iVar5);
    }
    if (bVar8 == 0) {
      __n = G_lcl_stream->ofs_;
      pCVar6 = CTcDataStream::add_anchor(G_lcl_stream,(CTcSymbol *)0x0,(CTcAbsFixup **)0x0,__n);
      CTcAbsFixup::add_abs_fixup
                (pCVar6->fixup_list_head_,&G_cs->super_CTcDataStream,
                 (G_cs->super_CTcDataStream).ofs_);
      uStack_38 = uStack_38 & 0xffffffff;
      CTcDataStream::write(&G_cs->super_CTcDataStream,(int)&uStack_38 + 4,(void *)0x4,__n);
      uStack_38._0_6_ =
           CONCAT24((short)(this->super_CTcSymLocalBase).super_CTcSymbol.super_CTcSymbolBase.
                           super_CVmHashEntryCS.super_CVmHashEntry.len_,(uint)uStack_38);
      CTcDataStream::write(G_lcl_stream,(int)&uStack_38 + 4,(void *)0x2,__n);
      ppCVar9 = (CTcCodeStream **)&G_lcl_stream;
    }
    else {
      uStack_38._0_6_ =
           CONCAT24((short)(this->super_CTcSymLocalBase).super_CTcSymbol.super_CTcSymbolBase.
                           super_CVmHashEntryCS.super_CVmHashEntry.len_,(uint)uStack_38);
      CTcDataStream::write(&G_cs->super_CTcDataStream,(int)&uStack_38 + 4,(void *)0x2,__n);
    }
    CTcDataStream::write
              (&(*ppCVar9)->super_CTcDataStream,
               (int)(this->super_CTcSymLocalBase).super_CTcSymbol.super_CTcSymbolBase.
                    super_CVmHashEntryCS.super_CVmHashEntry.str_,
               (void *)(this->super_CTcSymLocalBase).super_CTcSymbol.super_CTcSymbolBase.
                       super_CVmHashEntryCS.super_CVmHashEntry.len_,__n);
  }
  return 1;
}

Assistant:

int CTcSymLocal::write_to_debug_frame(int test_only)
{
    /* if this is test-only mode, just note that we will write it */
    if (test_only)
        return TRUE;

    /* 
     *   For version 2+ static compilation, write the symbol name
     *   out-of-line, to the separate stream for local variable names.  This
     *   allows us to consolidate the names so that each name is stored only
     *   once in the file.  This saves a lot of space since there are a few
     *   common local names that appear over and over.  Version 1 always
     *   wrote names in-line, and we also have to write the names in-line
     *   when generating dynamic code, since we can't add to the constant
     *   pool in this case.
     *   
     *   Also, store all 1- and 2-character names in-line.  1-character names
     *   are smaller if stored in-line since they'll take only three bytes
     *   (two bytes for the length, one byte for the string) vs four bytes
     *   for a shared pool pointer.  2-char names are a wash on the frame
     *   storage, but it's still more efficient to store them in-line because
     *   we avoid also creating the constant pool entry for them.  
     */
    int inl = (len_ <= 2
               || G_sizes.dbg_fmt_vsn < 2
               || G_cg->is_eval_for_dyn());
    
    /* 
     *   write my ID - if we're a context variable, we want to write the
     *   context variable ID; otherwise write our stack location as normal 
     */
    if (is_ctx_local_)
        G_cs->write2(ctx_var_num_);
    else
        G_cs->write2(var_num_);

    /* compute my flags */
    int flags = 0;
    if (is_param_)
        flags |= 0x0001;
    if (is_ctx_local_)
        flags |= 0x0002;
    if (!inl)
        flags |= 0x0004;

    /* write my flags */
    G_cs->write2(flags);

    /* write my local context array index */
    G_cs->write2(get_ctx_arr_idx());

    /* add zeros to pad any future version information for the target VM */
    for (int i = G_sizes.lcl_hdr - 6 ; i > 0 ; --i)
        G_cs->write(0);

    /* 
     *   write the name - either to the separate stream for local names, or
     *   inline if necessary 
     */
    if (inl)
    {
        /* write the symbol name to the table in-line */
        G_cs->write2(len_);
        G_cs->write(str_, len_);
    }
    else
    {
        /* add a fixup from the table to the local stream */
        CTcStreamAnchor *anchor = G_lcl_stream->add_anchor(0, 0);
        CTcAbsFixup::add_abs_fixup(anchor->fixup_list_head_,
                                   G_cs, G_cs->get_ofs());

        /* add the placeholder to the table (this is what we fix up) */
        G_cs->write4(0);

        /* write the name to the local stream */
        G_lcl_stream->write2(len_);
        G_lcl_stream->write(str_, len_);
    }

    /* we did write this symbol */
    return TRUE;
}